

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

bool __thiscall
HighsMipSolverData::solutionRowFeasible
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *solution)

{
  int iVar1;
  pointer piVar2;
  ulong uVar3;
  HighsLp *pHVar4;
  HighsInt j;
  long lVar5;
  bool bVar6;
  HighsCDouble local_68;
  ulong local_50;
  ulong local_48;
  HighsCDouble local_40;
  
  pHVar4 = this->mipsolver->model_;
  local_50 = 0;
  while( true ) {
    bVar6 = local_50 == (uint)pHVar4->num_row_;
    if (bVar6) {
      return true;
    }
    local_68.hi = 0.0;
    local_68.lo = 0.0;
    piVar2 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar2[local_50 + 1];
    uVar3 = local_50 + 1;
    local_48 = local_50;
    for (lVar5 = (long)piVar2[local_50]; local_50 = uVar3, iVar1 != lVar5; lVar5 = lVar5 + 1) {
      local_40.hi = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start
                    [(this->ARindex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar5]] *
                    (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5];
      local_40.lo = 0.0;
      HighsCDouble::operator+=(&local_68,&local_40);
      uVar3 = local_50;
    }
    pHVar4 = this->mipsolver->model_;
    if ((pHVar4->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[local_48] + this->feastol < local_68.hi + local_68.lo)
    break;
    if (local_68.hi + local_68.lo <
        (pHVar4->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[local_48] - this->feastol) {
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool HighsMipSolverData::solutionRowFeasible(
    const std::vector<double>& solution) const {
  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    HighsCDouble c_double_rowactivity = HighsCDouble(0.0);

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];

    for (HighsInt j = start; j != end; ++j)
      c_double_rowactivity += HighsCDouble(solution[ARindex_[j]] * ARvalue_[j]);

    double rowactivity = double(c_double_rowactivity);
    if (rowactivity > mipsolver.rowUpper(i) + feastol) return false;
    if (rowactivity < mipsolver.rowLower(i) - feastol) return false;
  }
  return true;
}